

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall
SGParser::Parse<SGParser::Generator::RegExprDFAParseElement>::Parse
          (Parse<SGParser::Generator::RegExprDFAParseElement> *this,ParseTable *ptable,
          TokenStream<SGParser::Generator::RegExprParseToken> *ptokenStream,size_t stackSize)

{
  this->pParseTable = (ParseTable *)0x0;
  this->pTokenizer = (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0;
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackingTokenStream
            (&this->Stream);
  this->StackPosition = 0;
  this->StackSize = 0;
  this->pStack = (RegExprDFAParseElement *)0x0;
  this->TopState = 0xffffffff;
  this->NextTokenFlag = false;
  this->PrevTokenIndex = 0xffffffffffffffff;
  (this->Token).super_TokenCode.Code = 1;
  (this->Token).ch = 0;
  this->ReduceLeft = 0;
  this->pValidTokenStackPositions = (size_t *)0x0;
  this->ErrorMarker = 0xffffffffffffffff;
  this->LastErrorState = 0xffffffff;
  (this->ErrorStackStr)._M_dataplus._M_p = (pointer)&(this->ErrorStackStr).field_2;
  (this->ErrorStackStr)._M_string_length = 0;
  (this->ErrorStackStr).field_2._M_local_buf[0] = '\0';
  Create(this,ptable,ptokenStream,stackSize);
  return;
}

Assistant:

Parse(const ParseTable* ptable, TokenStream<TokenType>* ptokenStream,
          size_t stackSize = DefaultStackSize) {
        Create(ptable, ptokenStream, stackSize);
    }